

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::QMdiAreaPrivate(QMdiAreaPrivate *this)

{
  QAbstractScrollAreaPrivate *in_RDI;
  
  QAbstractScrollAreaPrivate::QAbstractScrollAreaPrivate(in_RDI);
  *(undefined ***)&(in_RDI->super_QFramePrivate).super_QWidgetPrivate =
       &PTR__QMdiAreaPrivate_00d165d0;
  *(undefined8 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate = 0;
  *(undefined8 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x8 = 0;
  *(undefined8 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x10 = 0;
  *(undefined8 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x18 = 0;
  *(undefined8 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0x28 = 0;
  QList<QMdi::Rearranger_*>::QList((QList<QMdi::Rearranger_*> *)0x60df1d);
  QList<QPointer<QMdiSubWindow>_>::QList((QList<QPointer<QMdiSubWindow>_> *)0x60df2e);
  QList<QPointer<QMdiSubWindow>_>::QList((QList<QPointer<QMdiSubWindow>_> *)0x60df3f);
  QList<int>::QList((QList<int> *)0x60df50);
  QPointer<QMdiSubWindow>::QPointer((QPointer<QMdiSubWindow> *)0x60df61);
  QPointer<QMdiSubWindow>::QPointer((QPointer<QMdiSubWindow> *)0x60df72);
  QBrush::QBrush((QBrush *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.widgetItem);
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.extraPaintEngine = 0;
  QFlags<QMdiArea::AreaOption>::QFlags((QFlags<QMdiArea::AreaOption> *)0x60df9e);
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.polished = 0;
  *(undefined1 *)((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.polished + 4) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.polished + 5) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.polished + 6) = 0;
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.graphicsEffect = 0;
  *(undefined4 *)((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.graphicsEffect + 4) = 0;
  *(undefined1 *)
   &in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.imHints.
    super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.super_QFlagsStorage<Qt::InputMethodHint>.i = 0
  ;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.imHints.
           super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
           super_QFlagsStorage<Qt::InputMethodHint>.i + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.imHints.
           super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
           super_QFlagsStorage<Qt::InputMethodHint>.i + 2) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.imHints.
           super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
           super_QFlagsStorage<Qt::InputMethodHint>.i + 3) = 0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0xd4 = 0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0xd5 = 0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0xd6 = 0;
  in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.field_0xd7 = 0;
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.opaqueChildren.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.opaqueChildren.d + 4) =
       0xffffffff;
  *(undefined4 *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.dirty.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.dirty.d + 4) =
       0xffffffff;
  QBasicTimer::QBasicTimer
            ((QBasicTimer *)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.toolTip);
  QBasicTimer::QBasicTimer
            ((QBasicTimer *)
             ((long)&in_RDI[1].super_QFramePrivate.super_QWidgetPrivate.toolTip.d.d + 4));
  return;
}

Assistant:

QMdiAreaPrivate::QMdiAreaPrivate()
    : cascader(nullptr),
      regularTiler(nullptr),
      iconTiler(nullptr),
      placer(nullptr),
#if QT_CONFIG(rubberband)
      rubberBand(nullptr),
#endif
#if QT_CONFIG(tabbar)
      tabBar(nullptr),
#endif
      activationOrder(QMdiArea::CreationOrder),
      viewMode(QMdiArea::SubWindowView),
#if QT_CONFIG(tabbar)
      documentMode(false),
      tabsClosable(false),
      tabsMovable(false),
#endif
#if QT_CONFIG(tabwidget)
      tabShape(QTabWidget::Rounded),
      tabPosition(QTabWidget::North),
#endif
      ignoreGeometryChange(false),
      ignoreWindowStateChange(false),
      isActivated(false),
      isSubWindowsTiled(false),
      showActiveWindowMaximized(false),
      tileCalledFromResizeEvent(false),
      updatesDisabledByUs(false),
      inViewModeChange(false),
      indexToNextWindow(-1),
      indexToPreviousWindow(-1),
      indexToHighlighted(-1),
      indexToLastActiveTab(-1)
{
}